

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O0

int read_fdesign_line(char **name,char **value)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint local_28;
  int valueoffset;
  int x;
  int length;
  char **value_local;
  char **name_local;
  
  valueoffset = 0;
  do {
    while( true ) {
      uVar1 = getc((FILE *)fin);
      if (((int)uVar1 < 0) && (iVar2 = feof((FILE *)fin), iVar2 != 0)) {
        return 0;
      }
      if (uVar1 != 10) break;
      valueoffset = 0;
    }
    iVar2 = isspace(uVar1 & 0xff);
    if (iVar2 == 0) {
      buffer[valueoffset] = (char)uVar1;
      expand_buffer(valueoffset + 1);
      valueoffset = valueoffset + 1;
    }
    iVar2 = valueoffset;
  } while (uVar1 != 0x3a);
  buffer[valueoffset + -1] = '\0';
  do {
    local_28 = getc((FILE *)fin);
    if ((((int)local_28 < 0) && (iVar3 = feof((FILE *)fin), iVar3 != 0)) || (local_28 == 10)) break;
    iVar3 = isspace(local_28 & 0xff);
  } while (iVar3 != 0);
LAB_001bc9ac:
  if (local_28 == 0x5c) goto code_r0x001bc9b2;
  if (local_28 == 10) {
    buffer[valueoffset] = '\0';
    *name = buffer;
    *value = buffer + iVar2;
    return 1;
  }
  goto LAB_001bc9ce;
code_r0x001bc9b2:
  local_28 = read_quoted();
  if (-1 < (int)local_28) {
LAB_001bc9ce:
    buffer[valueoffset] = (char)local_28;
    expand_buffer(valueoffset + 1);
    local_28 = getc((FILE *)fin);
    valueoffset = valueoffset + 1;
  }
  goto LAB_001bc9ac;
}

Assistant:

int read_fdesign_line(const char*& name, const char*& value) {

  int length = 0;
  int x;
  // find a colon:
  for (;;) {
    x = getc(fin);
    if (x < 0 && feof(fin)) return 0;
    if (x == '\n') {length = 0; continue;} // no colon this line...
    if (!isspace(x & 255)) {
      buffer[length++] = x;
      expand_buffer(length);
    }
    if (x == ':') break;
  }
  int valueoffset = length;
  buffer[length-1] = 0;

  // skip to start of value:
  for (;;) {
    x = getc(fin);
    if ((x < 0 && feof(fin)) || x == '\n' || !isspace(x & 255)) break;
  }

  // read the value:
  for (;;) {
    if (x == '\\') {x = read_quoted(); if (x<0) continue;}
    else if (x == '\n') break;
    buffer[length++] = x;
    expand_buffer(length);
    x = getc(fin);
  }
  buffer[length] = 0;
  name = buffer;
  value = buffer+valueoffset;
  return 1;
}